

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

GPU_Target *
GPU_InitRendererByID(GPU_RendererID renderer_request,Uint16 w,Uint16 h,GPU_WindowFlagEnum SDL_flags)

{
  GPU_RendererID id;
  GPU_RendererID id_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  _Bool _Var9;
  GPU_Renderer *pGVar10;
  GPU_RendererID *pGVar11;
  GPU_Target *screen;
  GPU_Renderer *renderer;
  GPU_WindowFlagEnum SDL_flags_local;
  Uint16 h_local;
  Uint16 w_local;
  
  pGVar11 = &renderer_request;
  gpu_init_error_queue();
  gpu_init_renderer_register();
  _Var9 = gpu_init_SDL();
  if (_Var9) {
    uVar1 = pGVar11->renderer;
    uVar2 = pGVar11->major_version;
    uVar3 = pGVar11->minor_version;
    uVar4 = *(undefined4 *)&pGVar11->field_0x14;
    id.major_version = uVar4;
    id.renderer = uVar3;
    id.name._4_4_ = uVar2;
    id.name._0_4_ = uVar1;
    id._16_8_ = pGVar11;
    pGVar10 = gpu_create_and_add_renderer(id);
    if (pGVar10 == (GPU_Renderer *)0x0) {
      _SDL_flags_local = (GPU_Target *)0x0;
    }
    else {
      uVar5 = (pGVar10->id).renderer;
      uVar6 = (pGVar10->id).major_version;
      uVar7 = (pGVar10->id).minor_version;
      uVar8 = *(undefined4 *)&(pGVar10->id).field_0x14;
      id_00.major_version = uVar8;
      id_00.renderer = uVar7;
      id_00.name._4_4_ = uVar6;
      id_00.name._0_4_ = uVar5;
      id_00._16_8_ = pGVar11;
      GPU_SetCurrentRenderer(id_00);
      _SDL_flags_local = (*pGVar10->impl->Init)(pGVar10,*pGVar11,w,h,SDL_flags);
      if (_SDL_flags_local == (GPU_Target *)0x0) {
        GPU_PushErrorCode("GPU_InitRendererByID",GPU_ERROR_BACKEND_ERROR,
                          "Renderer %s failed to initialize properly",(pGVar10->id).name);
        _gpu_num_window_mappings = 0;
        GPU_CloseCurrentRenderer();
      }
      else {
        GPU_SetInitWindow(0);
      }
    }
  }
  else {
    _SDL_flags_local = (GPU_Target *)0x0;
  }
  return _SDL_flags_local;
}

Assistant:

GPU_Target* GPU_InitRendererByID(GPU_RendererID renderer_request, Uint16 w, Uint16 h, GPU_WindowFlagEnum SDL_flags)
{
    GPU_Renderer* renderer;
    GPU_Target* screen;

    gpu_init_error_queue();
    gpu_init_renderer_register();

    if(!gpu_init_SDL())
        return NULL;

    renderer = gpu_create_and_add_renderer(renderer_request);
    if(renderer == NULL)
        return NULL;

    GPU_SetCurrentRenderer(renderer->id);

    screen = renderer->impl->Init(renderer, renderer_request, w, h, SDL_flags);
    if(screen == NULL)
    {
        GPU_PushErrorCode("GPU_InitRendererByID", GPU_ERROR_BACKEND_ERROR, "Renderer %s failed to initialize properly", renderer->id.name);
        // Init failed, destroy the renderer...
        // Erase the window mappings
        _gpu_num_window_mappings = 0;
        GPU_CloseCurrentRenderer();
    }
    else
        GPU_SetInitWindow(0);
    return screen;
}